

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O2

cl_int clCommandSVMMemcpyKHR
                 (cl_command_buffer_khr command_buffer,cl_command_queue command_queue,
                 cl_command_properties_khr *properties,void *dst_ptr,void *src_ptr,size_t size,
                 cl_uint num_sync_points_in_wait_list,cl_sync_point_khr *sync_point_wait_list,
                 cl_sync_point_khr *sync_point,cl_mutable_command_khr *mutable_handle)

{
  CLIntercept *pIntercept;
  uint64_t enqueueCounter;
  cl_command_buffer_khr cmdbuf;
  byte bVar1;
  cl_int errorCode;
  CLdispatchX *pCVar2;
  time_point end;
  allocator local_99;
  time_point local_98;
  uint64_t local_90;
  size_t local_88;
  cl_command_buffer_khr local_80;
  string local_78;
  cl_command_properties_khr *local_58;
  string syncPointWaitList;
  
  pIntercept = g_pIntercept;
  if (g_pIntercept == (CLIntercept *)0x0) {
    return -0x472;
  }
  local_88 = size;
  local_80 = command_buffer;
  local_58 = properties;
  pCVar2 = CLIntercept::dispatchX(g_pIntercept,command_buffer);
  if (pCVar2->clCommandSVMMemcpyKHR ==
      (_func_cl_int_cl_command_buffer_khr_cl_command_queue_cl_command_properties_khr_ptr_void_ptr_void_ptr_size_t_cl_uint_cl_sync_point_khr_ptr_cl_sync_point_khr_ptr_cl_mutable_command_khr_ptr
       *)0x0) {
    return -0x472;
  }
  local_90 = (pIntercept->m_EnqueueCounter).super___atomic_base<unsigned_long>._M_i;
  getFormattedSyncPointWaitList_abi_cxx11_
            (&syncPointWaitList,pIntercept,num_sync_points_in_wait_list,sync_point_wait_list);
  if ((pIntercept->m_Config).CallLogging == true) {
    CLIntercept::callLoggingEnter
              (pIntercept,"clCommandSVMMemcpyKHR",local_90,(cl_kernel)0x0,
               "command_buffer = %p, command_queue = %p, dst_ptr = %p, src_ptr = %p, size = %zu%s",
               local_80,command_queue,dst_ptr,src_ptr,local_88,syncPointWaitList._M_dataplus._M_p);
  }
  if (((pIntercept->m_Config).HostPerformanceTiming == false) &&
     ((pIntercept->m_Config).ChromeCallLogging != true)) {
    local_98.__d.__r = (duration)0;
  }
  else {
    local_98.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  }
  cmdbuf = local_80;
  errorCode = (*pCVar2->clCommandSVMMemcpyKHR)
                        (local_80,command_queue,local_58,dst_ptr,src_ptr,local_88,
                         num_sync_points_in_wait_list,sync_point_wait_list,sync_point,mutable_handle
                        );
  enqueueCounter = local_90;
  if (((pIntercept->m_Config).HostPerformanceTiming == false) &&
     ((pIntercept->m_Config).ChromeCallLogging != true)) {
    end.__d.__r = (duration)0;
  }
  else {
    end.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    if (((pIntercept->m_Config).HostPerformanceTiming == true) &&
       (((pIntercept->m_Config).HostPerformanceTimingMinEnqueue <= enqueueCounter &&
        (enqueueCounter <= (pIntercept->m_Config).HostPerformanceTimingMaxEnqueue)))) {
      std::__cxx11::string::string((string *)&local_78,"",&local_99);
      CLIntercept::updateHostTimingStats(pIntercept,"clCommandSVMMemcpyKHR",&local_78,local_98,end);
      std::__cxx11::string::~string((string *)&local_78);
    }
  }
  if ((pIntercept->m_Config).ErrorLogging == false) {
    bVar1 = (pIntercept->m_Config).ErrorAssert;
    if ((bool)bVar1 == false) {
      if ((errorCode == 0) || ((pIntercept->m_Config).NoErrors == false)) goto LAB_0013b51e;
    }
    else if (errorCode == 0) goto LAB_0013b4f0;
  }
  else {
    if (errorCode == 0) {
LAB_0013b4f0:
      errorCode = 0;
      goto LAB_0013b51e;
    }
    CLIntercept::logError(pIntercept,"clCommandSVMMemcpyKHR",errorCode);
    bVar1 = (pIntercept->m_Config).ErrorAssert;
  }
  if ((bVar1 & 1) != 0) {
    raise(5);
  }
  if ((pIntercept->m_Config).NoErrors != false) {
    errorCode = 0;
  }
LAB_0013b51e:
  if (((cmdbuf != (cl_command_buffer_khr)0x0) && (errorCode == 0)) &&
     ((pIntercept->m_Config).DumpCommandBuffers == true)) {
    std::__cxx11::string::string((string *)&local_78,"",&local_99);
    CLIntercept::recordCommandBufferCommand
              (pIntercept,cmdbuf,"clCommandSVMMemcpyKHR",&local_78,num_sync_points_in_wait_list,
               sync_point_wait_list,sync_point);
    std::__cxx11::string::~string((string *)&local_78);
  }
  if ((pIntercept->m_Config).CallLogging == true) {
    CLIntercept::callLoggingExit
              (pIntercept,"clCommandSVMMemcpyKHR",errorCode,(cl_event *)0x0,sync_point);
  }
  if ((pIntercept->m_Config).ChromeCallLogging == true) {
    std::__cxx11::string::string((string *)&local_78,"",&local_99);
    CLIntercept::chromeCallLoggingExit
              (pIntercept,"clCommandSVMMemcpyKHR",&local_78,true,enqueueCounter,local_98,end);
    std::__cxx11::string::~string((string *)&local_78);
  }
  if ((mutable_handle != (cl_mutable_command_khr *)0x0) &&
     (*mutable_handle != (cl_mutable_command_khr)0x0)) {
    CLIntercept::addMutableCommandInfo(pIntercept,*mutable_handle,cmdbuf,0);
  }
  std::__cxx11::string::~string((string *)&syncPointWaitList);
  return errorCode;
}

Assistant:

CL_API_ENTRY cl_int CL_API_CALL clCommandSVMMemcpyKHR(
    cl_command_buffer_khr command_buffer,
    cl_command_queue command_queue,
    const cl_command_properties_khr* properties,
    void* dst_ptr,
    const void* src_ptr,
    size_t size,
    cl_uint num_sync_points_in_wait_list,
    const cl_sync_point_khr* sync_point_wait_list,
    cl_sync_point_khr* sync_point,
    cl_mutable_command_khr* mutable_handle)
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept )
    {
        const auto& dispatchX = pIntercept->dispatchX(command_buffer);
        if( dispatchX.clCommandSVMMemcpyKHR )
        {
            GET_ENQUEUE_COUNTER();

            const std::string syncPointWaitList = getFormattedSyncPointWaitList(
                pIntercept,
                num_sync_points_in_wait_list,
                sync_point_wait_list);

            CALL_LOGGING_ENTER(
                "command_buffer = %p, command_queue = %p, dst_ptr = %p, src_ptr = %p, size = %zu%s",
                command_buffer,
                command_queue,
                dst_ptr,
                src_ptr,
                size,
                syncPointWaitList.c_str() );
            HOST_PERFORMANCE_TIMING_START();

            cl_int  retVal = dispatchX.clCommandSVMMemcpyKHR(
                command_buffer,
                command_queue,
                properties,
                dst_ptr,
                src_ptr,
                size,
                num_sync_points_in_wait_list,
                sync_point_wait_list,
                sync_point,
                mutable_handle );

            HOST_PERFORMANCE_TIMING_END();
            CHECK_ERROR( retVal );
            RECORD_COMMAND_BUFFER_COMMAND(
                retVal,
                command_buffer,
                num_sync_points_in_wait_list,
                sync_point_wait_list,
                sync_point );
            CALL_LOGGING_EXIT_SYNC_POINT( retVal, sync_point );
            ADD_MUTABLE_COMMAND( mutable_handle, command_buffer );

            return retVal;
        }
    }

    NULL_FUNCTION_POINTER_RETURN_ERROR(CL_INVALID_COMMAND_BUFFER_KHR);
}